

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

optional<Patch::Change> * __thiscall
Patch::get_change_starting_before_position<Patch::OldCoordinates>
          (optional<Patch::Change> *__return_storage_ptr__,Patch *this,Point target)

{
  int iVar1;
  _Head_base<0UL,_Text_*,_false> _Var2;
  _Head_base<0UL,_Text_*,_false> _Var3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Node *pNVar7;
  Point PVar8;
  Node *pNVar9;
  optional<Patch::Change> *poVar10;
  uint32_t uVar11;
  Point node_old_start;
  Point node_new_start;
  PositionStackEntry found_node_left_ancestor_info;
  PositionStackEntry left_ancestor_info;
  Point local_a0;
  optional<Patch::Change> *local_98;
  Point local_90;
  Point local_88;
  Point PStack_80;
  undefined8 local_78;
  Point local_70;
  Point PStack_68;
  undefined8 local_60;
  Point local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  pNVar7 = this->root;
  local_98 = __return_storage_ptr__;
  local_38 = target;
  Point::Point(&local_70);
  Point::Point(&PStack_68);
  pNVar9 = (Node *)0x0;
  local_60 = 0;
  Point::Point(&local_88);
  Point::Point(&PStack_80);
  local_78 = 0;
  do {
    if (pNVar7 == (Node *)0x0) break;
    local_a0 = Point::traverse(&local_70,&pNVar7->old_distance_from_left_ancestor);
    local_90 = Point::traverse(&PStack_68,&pNVar7->new_distance_from_left_ancestor);
    local_40 = local_a0;
    bVar4 = Point::operator<=(&local_40,&local_38);
    if (bVar4) {
      local_78 = local_60;
      local_88 = local_70;
      PStack_80 = PStack_68;
      bVar4 = false;
      uVar11 = 0;
      pNVar9 = pNVar7;
      if (pNVar7->right != (Node *)0x0) {
        local_70 = Point::traverse(&local_a0,&pNVar7->old_extent);
        PStack_68 = Point::traverse(&local_90,&pNVar7->new_extent);
        if (pNVar7->left != (Node *)0x0) {
          uVar11 = pNVar7->left->old_subtree_text_size;
        }
        _Var2._M_head_impl =
             (pNVar7->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
             super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
        if (_Var2._M_head_impl == (Text *)0x0) {
          uVar5 = pNVar7->old_text_size_;
        }
        else {
          uVar5 = Text::size(_Var2._M_head_impl);
        }
        iVar1 = (int)local_60 + uVar5 + uVar11;
        uVar5 = 0;
        uVar11 = 0;
        if (pNVar7->left != (Node *)0x0) {
          uVar11 = pNVar7->left->new_subtree_text_size;
        }
        _Var2._M_head_impl =
             (pNVar7->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
             super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
             super__Head_base<0UL,_Text_*,_false>._M_head_impl;
        local_60._0_4_ = iVar1;
        if (_Var2._M_head_impl != (Text *)0x0) {
          uVar5 = Text::size(_Var2._M_head_impl);
        }
        local_60 = CONCAT44(local_60._4_4_ + uVar5 + uVar11,(int)local_60);
        bVar4 = true;
        pNVar7 = pNVar7->right;
      }
    }
    else {
      bVar4 = pNVar7->left != (Node *)0x0;
      if (bVar4) {
        pNVar7 = pNVar7->left;
      }
    }
  } while (bVar4);
  poVar10 = local_98;
  if (pNVar9 == (Node *)0x0) {
    optional<Patch::Change>::optional(local_98);
  }
  else {
    local_a0 = Point::traverse(&local_88,&pNVar9->old_distance_from_left_ancestor);
    local_90 = Point::traverse(&PStack_80,&pNVar9->new_distance_from_left_ancestor);
    local_48 = local_a0;
    local_50 = Point::traverse(&local_a0,&pNVar9->old_extent);
    local_58 = local_90;
    PVar8 = Point::traverse(&local_90,&pNVar9->new_extent);
    pNVar7 = pNVar9->left;
    uVar5 = 0;
    uVar11 = 0;
    if (pNVar7 != (Node *)0x0) {
      uVar11 = pNVar7->old_subtree_text_size;
    }
    _Var2._M_head_impl =
         (pNVar9->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
         super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
         super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    if (pNVar7 != (Node *)0x0) {
      uVar5 = pNVar7->new_subtree_text_size;
    }
    uVar5 = uVar5 + local_78._4_4_;
    _Var3._M_head_impl =
         (pNVar9->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
         super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
         super__Head_base<0UL,_Text_*,_false>._M_head_impl;
    uVar11 = uVar11 + (int)local_78;
    if (_Var2._M_head_impl == (Text *)0x0) {
      uVar6 = pNVar9->old_text_size_;
    }
    else {
      uVar6 = Text::size(_Var2._M_head_impl);
    }
    (local_98->value).old_start = local_48;
    (local_98->value).old_end = local_50;
    (local_98->value).new_start = local_58;
    (local_98->value).new_end = PVar8;
    (local_98->value).old_text = _Var2._M_head_impl;
    (local_98->value).new_text = _Var3._M_head_impl;
    (local_98->value).preceding_old_text_size = uVar11;
    (local_98->value).preceding_new_text_size = uVar5;
    (local_98->value).old_text_size = uVar6;
    local_98->is_some = true;
    poVar10 = local_98;
  }
  return poVar10;
}

Assistant:

optional<Patch::Change> Patch::get_change_starting_before_position(Point target) const {
  const Node *found_node = nullptr;
  const Node *node = root;
  Patch::PositionStackEntry left_ancestor_info;
  Patch::PositionStackEntry found_node_left_ancestor_info;

  while (node) {
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    if (CoordinateSpace::choose(node_old_start, node_new_start) <= target) {
      found_node = node;
      found_node_left_ancestor_info = left_ancestor_info;
      if (node->right) {
        left_ancestor_info.old_end = node_old_start.traverse(node->old_extent);
        left_ancestor_info.new_end = node_new_start.traverse(node->new_extent);
        left_ancestor_info.total_old_text_size += node->left_subtree_old_text_size() + node->old_text_size();
        left_ancestor_info.total_new_text_size += node->left_subtree_new_text_size() + node->new_text_size();
        node = node->right;
      } else {
        break;
      }
    } else {
      if (node->left) {
        node = node->left;
      } else {
        break;
      }
    }
  }

  if (found_node) {
    Point old_start = found_node_left_ancestor_info.old_end.traverse(found_node->old_distance_from_left_ancestor);
    Point new_start = found_node_left_ancestor_info.new_end.traverse(found_node->new_distance_from_left_ancestor);

    return Change{
      old_start, old_start.traverse(found_node->old_extent),
      new_start, new_start.traverse(found_node->new_extent),
      found_node->old_text.get(),
      found_node->new_text.get(),
      found_node_left_ancestor_info.total_old_text_size + found_node->left_subtree_old_text_size(),
      found_node_left_ancestor_info.total_new_text_size + found_node->left_subtree_new_text_size(),
      found_node->old_text_size()
    };
  } else {
    return optional<Change>{};
  }
}